

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O2

void ncnn::pack_B_tile(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined4 *puVar8;
  long lVar9;
  undefined8 *puVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  void *pvVar38;
  void *pvVar39;
  long lVar40;
  undefined1 (*pauVar41) [16];
  size_t *psVar42;
  long lVar43;
  long lVar44;
  undefined8 *puVar45;
  ulong uVar46;
  undefined1 (*pauVar47) [32];
  int iVar48;
  int iVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  undefined1 (*pauVar57) [32];
  int iVar58;
  long lVar59;
  int iVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  bool bVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  long local_150;
  long local_148;
  long local_140;
  long local_118;
  long local_110;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_b0;
  
  psVar42 = (size_t *)&B->w;
  if (B->dims == 3) {
    psVar42 = &B->cstep;
  }
  iVar60 = (int)*psVar42;
  lVar63 = (long)iVar60;
  local_b0 = 0;
  iVar58 = 0;
  if (0 < max_kk) {
    iVar58 = max_kk;
  }
  lVar55 = (long)j;
  lVar9 = (long)k * 4;
  lVar40 = lVar9 + (lVar55 + 1) * lVar63 * 4;
  lVar54 = lVar9 + (lVar55 + 2) * lVar63 * 4;
  lVar59 = lVar9 + (lVar55 + 3) * lVar63 * 4;
  lVar1 = lVar9 + lVar63 * lVar55 * 4;
  lVar65 = (long)(k * 4) * 4;
  lVar53 = lVar65 + lVar63 * lVar55 * 4;
  lVar50 = (lVar55 + 4) * lVar63;
  local_110 = lVar65 + lVar50 * 4;
  lVar50 = lVar9 + lVar50 * 4;
  lVar2 = lVar9 + (lVar55 + 5) * lVar63 * 4;
  lVar3 = lVar9 + (lVar55 + 6) * lVar63 * 4;
  lVar4 = lVar9 + (lVar55 + 7) * lVar63 * 4;
  lVar61 = (lVar55 + 8) * lVar63;
  lVar65 = lVar65 + lVar61 * 4;
  lVar5 = lVar9 + (lVar55 + 0xb) * lVar63 * 4;
  lVar6 = lVar9 + (lVar55 + 10) * lVar63 * 4;
  lVar7 = lVar9 + (lVar55 + 9) * lVar63 * 4;
  lVar9 = lVar9 + lVar61 * 4;
  pauVar57 = (undefined1 (*) [32])BT->data;
  lVar43 = (long)(k << 4);
  lVar44 = (long)(k * 8);
  lVar36 = (long)max_jj;
  iVar17 = B->elempack;
  lVar37 = lVar63 * 0x30;
  lVar61 = lVar44 * 4;
  lVar56 = lVar7;
  local_148 = lVar59;
  lVar62 = lVar6;
  lVar64 = lVar5;
  lVar66 = lVar9;
  local_150 = lVar1;
  local_140 = lVar40;
  local_118 = lVar54;
  local_e0 = lVar50;
  local_d8 = lVar2;
  local_d0 = lVar3;
  local_c8 = lVar4;
  for (uVar46 = 0; (long)uVar46 < lVar36 + -0xb; uVar46 = uVar46 + 0xc) {
    if (iVar17 == 0x10) {
      pvVar38 = B->data;
      iVar34 = j + (int)uVar46;
      iVar48 = iVar34 % 0x10;
      iVar35 = (iVar34 / 0x10) * 0x10;
      puVar45 = (undefined8 *)((long)pvVar38 + lVar43 * 4 + (long)(iVar35 * iVar60) * 4);
      iVar34 = iVar58;
      if (iVar48 == 0) {
        while (iVar34 != 0) {
          uVar31 = puVar45[1];
          uVar32 = puVar45[2];
          uVar33 = puVar45[3];
          *(undefined8 *)*pauVar57 = *puVar45;
          *(undefined8 *)(*pauVar57 + 8) = uVar31;
          *(undefined8 *)(*pauVar57 + 0x10) = uVar32;
          *(undefined8 *)(*pauVar57 + 0x18) = uVar33;
          *(undefined1 (*) [16])pauVar57[1] = *(undefined1 (*) [16])(puVar45 + 4);
          pauVar57 = (undefined1 (*) [32])(pauVar57[1] + 0x10);
          puVar45 = puVar45 + 8;
          iVar34 = iVar34 + -1;
        }
      }
      iVar34 = iVar58;
      if (iVar48 == 4) {
        while (iVar34 != 0) {
          uVar31 = puVar45[3];
          uVar32 = puVar45[4];
          uVar33 = puVar45[5];
          *(undefined8 *)*pauVar57 = puVar45[2];
          *(undefined8 *)(*pauVar57 + 8) = uVar31;
          *(undefined8 *)(*pauVar57 + 0x10) = uVar32;
          *(undefined8 *)(*pauVar57 + 0x18) = uVar33;
          *(undefined1 (*) [16])pauVar57[1] = *(undefined1 (*) [16])(puVar45 + 6);
          pauVar57 = (undefined1 (*) [32])(pauVar57[1] + 0x10);
          puVar45 = puVar45 + 8;
          iVar34 = iVar34 + -1;
        }
      }
      pauVar41 = (undefined1 (*) [16])
                 ((long)pvVar38 + lVar43 * 4 + (long)((iVar35 + 0x10) * iVar60) * 4);
      iVar34 = iVar58;
      if (iVar48 == 8) {
        while (iVar34 != 0) {
          uVar31 = puVar45[5];
          uVar32 = puVar45[6];
          uVar33 = puVar45[7];
          *(undefined8 *)*pauVar57 = puVar45[4];
          *(undefined8 *)(*pauVar57 + 8) = uVar31;
          *(undefined8 *)(*pauVar57 + 0x10) = uVar32;
          *(undefined8 *)(*pauVar57 + 0x18) = uVar33;
          *(undefined1 (*) [16])pauVar57[1] = *pauVar41;
          pauVar57 = (undefined1 (*) [32])(pauVar57[1] + 0x10);
          puVar45 = puVar45 + 8;
          pauVar41 = pauVar41 + 4;
          iVar34 = iVar34 + -1;
        }
      }
      if (iVar48 == 0xc) {
        lVar51 = 0;
        iVar34 = iVar58;
        while (bVar67 = iVar34 != 0, iVar34 = iVar34 + -1, bVar67) {
          puVar10 = (undefined8 *)((long)puVar45 + lVar51 + 0x30);
          uVar31 = puVar10[1];
          *(undefined8 *)*pauVar57 = *puVar10;
          *(undefined8 *)(*pauVar57 + 8) = uVar31;
          *(undefined1 (*) [32])(*pauVar57 + 0x10) = *(undefined1 (*) [32])(*pauVar41 + lVar51);
          pauVar57 = (undefined1 (*) [32])(pauVar57[1] + 0x10);
          lVar51 = lVar51 + 0x40;
        }
      }
    }
    if (iVar17 == 8) {
      iVar35 = j + (int)uVar46;
      iVar34 = iVar35 / 8;
      iVar35 = iVar35 % 8;
      pvVar38 = (void *)((long)B->data + (long)(iVar34 * 8 * iVar60) * 4);
      pvVar39 = (void *)((long)B->data + (long)((iVar34 * 8 + 8) * iVar60) * 4);
      iVar34 = iVar58;
      if (iVar35 == 0) {
        while (iVar34 != 0) {
          puVar45 = (undefined8 *)((long)pvVar38 + lVar61);
          uVar31 = puVar45[1];
          uVar32 = puVar45[2];
          uVar33 = puVar45[3];
          *(undefined8 *)*pauVar57 = *puVar45;
          *(undefined8 *)(*pauVar57 + 8) = uVar31;
          *(undefined8 *)(*pauVar57 + 0x10) = uVar32;
          *(undefined8 *)(*pauVar57 + 0x18) = uVar33;
          *(undefined1 (*) [16])pauVar57[1] = *(undefined1 (*) [16])((long)pvVar39 + lVar61);
          pauVar57 = (undefined1 (*) [32])(pauVar57[1] + 0x10);
          pvVar39 = (void *)((long)pvVar39 + 0x20);
          pvVar38 = (void *)((long)pvVar38 + 0x20);
          iVar34 = iVar34 + -1;
        }
        pvVar39 = (void *)((long)pvVar39 + lVar61);
        pvVar38 = (void *)((long)pvVar38 + lVar61);
      }
      else {
        pvVar38 = (void *)((long)pvVar38 + lVar44 * 4);
        pvVar39 = (void *)((long)pvVar39 + lVar44 * 4);
      }
      if (iVar35 == 4) {
        lVar51 = 0;
        iVar34 = iVar58;
        while (bVar67 = iVar34 != 0, iVar34 = iVar34 + -1, bVar67) {
          puVar45 = (undefined8 *)((long)pvVar38 + lVar51 + 0x10);
          uVar31 = puVar45[1];
          *(undefined8 *)*pauVar57 = *puVar45;
          *(undefined8 *)(*pauVar57 + 8) = uVar31;
          *(undefined1 (*) [32])(*pauVar57 + 0x10) = *(undefined1 (*) [32])((long)pvVar39 + lVar51);
          pauVar57 = (undefined1 (*) [32])(pauVar57[1] + 0x10);
          lVar51 = lVar51 + 0x20;
        }
      }
    }
    if (iVar17 == 4) {
      pvVar38 = B->data;
      iVar34 = iVar58;
      while (bVar67 = iVar34 != 0, iVar34 = iVar34 + -1, bVar67) {
        uVar31 = ((undefined8 *)((long)pvVar38 + lVar53))[1];
        *(undefined8 *)*pauVar57 = *(undefined8 *)((long)pvVar38 + lVar53);
        *(undefined8 *)(*pauVar57 + 8) = uVar31;
        uVar31 = ((undefined8 *)((long)pvVar38 + local_110))[1];
        *(undefined8 *)(*pauVar57 + 0x10) = *(undefined8 *)((long)pvVar38 + local_110);
        *(undefined8 *)(*pauVar57 + 0x18) = uVar31;
        *(undefined1 (*) [16])pauVar57[1] = *(undefined1 (*) [16])((long)pvVar38 + lVar65);
        pauVar57 = (undefined1 (*) [32])(pauVar57[1] + 0x10);
        pvVar38 = (void *)((long)pvVar38 + 0x10);
      }
    }
    if (iVar17 == 1) {
      pvVar38 = B->data;
      lVar51 = (long)pvVar38 + local_b0;
      lVar52 = 0;
      pvVar39 = pvVar38;
      for (iVar34 = 0; iVar34 + 7 < max_kk; iVar34 = iVar34 + 8) {
        auVar11 = *(undefined1 (*) [32])(lVar51 + lVar1);
        auVar70 = *(undefined1 (*) [32])(lVar51 + lVar40);
        auVar71 = *(undefined1 (*) [32])(lVar51 + lVar54);
        auVar12 = *(undefined1 (*) [32])(lVar51 + lVar59);
        auVar13 = *(undefined1 (*) [32])(lVar51 + lVar50);
        auVar72 = *(undefined1 (*) [32])(lVar51 + lVar2);
        auVar14 = *(undefined1 (*) [32])(lVar51 + lVar3);
        auVar15 = *(undefined1 (*) [32])(lVar51 + lVar4);
        auVar16 = *(undefined1 (*) [32])(lVar51 + lVar9);
        auVar73 = *(undefined1 (*) [32])(lVar51 + lVar7);
        auVar74 = *(undefined1 (*) [32])(lVar51 + lVar6);
        auVar76 = *(undefined1 (*) [32])(lVar51 + lVar5);
        auVar77 = vunpcklps_avx(auVar11,auVar70);
        auVar70 = vunpckhps_avx(auVar11,auVar70);
        auVar11 = vunpcklps_avx(auVar71,auVar12);
        auVar71 = vunpckhps_avx(auVar71,auVar12);
        auVar68 = vunpcklps_avx(auVar13,auVar72);
        auVar12 = vunpckhps_avx(auVar13,auVar72);
        auVar69 = vunpcklps_avx(auVar14,auVar15);
        auVar13 = vunpckhps_avx(auVar14,auVar15);
        auVar75 = vunpcklps_avx(auVar16,auVar73);
        auVar72 = vunpckhps_avx(auVar16,auVar73);
        auVar78 = vunpcklps_avx(auVar74,auVar76);
        auVar14 = vunpckhps_avx(auVar74,auVar76);
        auVar15 = vunpcklpd_avx(auVar77,auVar11);
        auVar11 = vunpckhpd_avx(auVar77,auVar11);
        auVar16 = vunpcklpd_avx(auVar70,auVar71);
        auVar70 = vunpckhpd_avx(auVar70,auVar71);
        auVar73 = vunpcklpd_avx(auVar68,auVar69);
        auVar71 = vunpckhpd_avx(auVar68,auVar69);
        auVar74 = vunpcklpd_avx(auVar12,auVar13);
        auVar12 = vunpckhpd_avx(auVar12,auVar13);
        auVar76 = vunpcklpd_avx(auVar75,auVar78);
        auVar13 = vunpckhpd_avx(auVar75,auVar78);
        auVar77 = vunpcklpd_avx(auVar72,auVar14);
        auVar72 = vunpckhpd_avx(auVar72,auVar14);
        auVar75._16_16_ = auVar73._0_16_;
        auVar75._0_16_ = auVar15._0_16_;
        auVar78._16_16_ = auVar11._0_16_;
        auVar78._0_16_ = auVar76._0_16_;
        auVar79._16_16_ = auVar13._0_16_;
        auVar79._0_16_ = auVar71._0_16_;
        auVar80._16_16_ = auVar74._0_16_;
        auVar80._0_16_ = auVar16._0_16_;
        auVar68 = vinsertf32x4_avx512vl(auVar77,auVar70._0_16_,1);
        auVar69 = vinsertf32x4_avx512vl(auVar12,auVar72._0_16_,1);
        auVar14 = vperm2f128_avx(auVar15,auVar73,0x31);
        auVar11 = vperm2f128_avx(auVar76,auVar11,0x31);
        auVar71 = vperm2f128_avx(auVar71,auVar13,0x31);
        auVar13 = vperm2f128_avx(auVar16,auVar74,0x31);
        auVar70 = vperm2f128_avx(auVar77,auVar70,0x31);
        auVar12 = vperm2f128_avx(auVar12,auVar72,0x31);
        *pauVar57 = auVar75;
        pauVar57[1] = auVar78;
        pauVar57[2] = auVar79;
        pauVar57[3] = auVar80;
        pauVar57[4] = auVar68;
        pauVar57[5] = auVar69;
        pauVar57[6] = auVar14;
        pauVar57[7] = auVar11;
        pauVar57[8] = auVar71;
        pauVar57[9] = auVar13;
        pauVar57[10] = auVar70;
        pauVar57[0xb] = auVar12;
        pauVar57 = pauVar57 + 0xc;
        lVar51 = lVar51 + 0x20;
        pvVar39 = (void *)((long)pvVar39 + 0x20);
        lVar52 = lVar52 + 8;
      }
      for (; iVar34 + 3 < max_kk; iVar34 = iVar34 + 4) {
        auVar27 = vunpcklps_avx(*(undefined1 (*) [16])((long)pvVar39 + local_150),
                                *(undefined1 (*) [16])((long)pvVar39 + local_140));
        auVar28 = vunpcklps_avx(*(undefined1 (*) [16])((long)pvVar39 + local_118),
                                *(undefined1 (*) [16])((long)pvVar39 + local_148));
        auVar18 = vunpckhps_avx(*(undefined1 (*) [16])((long)pvVar39 + local_150),
                                *(undefined1 (*) [16])((long)pvVar39 + local_140));
        auVar19 = vunpckhps_avx(*(undefined1 (*) [16])((long)pvVar39 + local_118),
                                *(undefined1 (*) [16])((long)pvVar39 + local_148));
        auVar22 = vunpcklpd_avx(auVar27,auVar28);
        auVar27 = vunpckhpd_avx(auVar27,auVar28);
        auVar23 = vunpcklpd_avx(auVar18,auVar19);
        auVar18 = vunpckhpd_avx(auVar18,auVar19);
        auVar19 = vunpcklps_avx(*(undefined1 (*) [16])((long)pvVar39 + local_e0),
                                *(undefined1 (*) [16])((long)pvVar39 + local_d8));
        auVar29 = vunpcklps_avx(*(undefined1 (*) [16])((long)pvVar39 + local_d0),
                                *(undefined1 (*) [16])((long)pvVar39 + local_c8));
        auVar28 = vunpckhps_avx(*(undefined1 (*) [16])((long)pvVar39 + local_e0),
                                *(undefined1 (*) [16])((long)pvVar39 + local_d8));
        auVar20 = vunpckhps_avx(*(undefined1 (*) [16])((long)pvVar39 + local_d0),
                                *(undefined1 (*) [16])((long)pvVar39 + local_c8));
        auVar24 = vunpcklpd_avx(auVar19,auVar29);
        auVar19 = vunpckhpd_avx(auVar19,auVar29);
        auVar25 = vunpcklpd_avx(auVar28,auVar20);
        auVar28 = vunpckhpd_avx(auVar28,auVar20);
        auVar20 = vunpcklps_avx(*(undefined1 (*) [16])((long)pvVar39 + lVar66),
                                *(undefined1 (*) [16])((long)pvVar39 + lVar56));
        auVar30 = vunpcklps_avx(*(undefined1 (*) [16])((long)pvVar39 + lVar62),
                                *(undefined1 (*) [16])((long)pvVar39 + lVar64));
        auVar29 = vunpckhps_avx(*(undefined1 (*) [16])((long)pvVar39 + lVar66),
                                *(undefined1 (*) [16])((long)pvVar39 + lVar56));
        auVar21 = vunpckhps_avx(*(undefined1 (*) [16])((long)pvVar39 + lVar62),
                                *(undefined1 (*) [16])((long)pvVar39 + lVar64));
        auVar26 = vunpcklpd_avx(auVar20,auVar30);
        auVar20 = vunpckhpd_avx(auVar20,auVar30);
        auVar30 = vunpcklpd_avx(auVar29,auVar21);
        auVar29 = vunpckhpd_avx(auVar29,auVar21);
        *(undefined1 (*) [16])*pauVar57 = auVar22;
        *(undefined1 (*) [16])(*pauVar57 + 0x10) = auVar24;
        *(undefined1 (*) [16])pauVar57[1] = auVar26;
        *(undefined1 (*) [16])(pauVar57[1] + 0x10) = auVar27;
        *(undefined1 (*) [16])pauVar57[2] = auVar19;
        *(undefined1 (*) [16])(pauVar57[2] + 0x10) = auVar20;
        *(undefined1 (*) [16])pauVar57[3] = auVar23;
        *(undefined1 (*) [16])(pauVar57[3] + 0x10) = auVar25;
        *(undefined1 (*) [16])pauVar57[4] = auVar30;
        *(undefined1 (*) [16])(pauVar57[4] + 0x10) = auVar18;
        *(undefined1 (*) [16])pauVar57[5] = auVar28;
        *(undefined1 (*) [16])(pauVar57[5] + 0x10) = auVar29;
        pauVar57 = pauVar57 + 6;
        pvVar39 = (void *)((long)pvVar39 + 0x10);
        lVar52 = lVar52 + 4;
      }
      for (; (int)lVar52 < max_kk; lVar52 = lVar52 + 1) {
        puVar8 = (undefined4 *)((long)pvVar38 + lVar52 * 4 + local_150);
        *(undefined4 *)*pauVar57 = *puVar8;
        *(undefined4 *)(*pauVar57 + 4) = puVar8[lVar63];
        *(undefined4 *)(*pauVar57 + 8) = puVar8[lVar63 * 2];
        *(undefined4 *)(*pauVar57 + 0xc) = puVar8[lVar63 * 3];
        *(undefined4 *)(*pauVar57 + 0x10) = puVar8[lVar63 * 4];
        *(undefined4 *)(*pauVar57 + 0x14) = puVar8[lVar63 * 5];
        *(undefined4 *)(*pauVar57 + 0x18) = puVar8[lVar63 * 6];
        *(undefined4 *)(*pauVar57 + 0x1c) = puVar8[lVar63 * 7];
        *(undefined4 *)pauVar57[1] = puVar8[lVar63 * 8];
        *(undefined4 *)(pauVar57[1] + 4) = puVar8[lVar63 * 9];
        *(undefined4 *)(pauVar57[1] + 8) = puVar8[lVar63 * 10];
        *(undefined4 *)(pauVar57[1] + 0xc) = puVar8[lVar63 * 0xb];
        pauVar57 = (undefined1 (*) [32])(pauVar57[1] + 0x10);
      }
    }
    local_150 = local_150 + lVar37;
    local_140 = local_140 + lVar37;
    local_118 = local_118 + lVar37;
    local_148 = local_148 + lVar37;
    lVar53 = lVar53 + lVar37;
    local_110 = local_110 + lVar37;
    local_e0 = local_e0 + lVar37;
    local_d8 = local_d8 + lVar37;
    local_d0 = local_d0 + lVar37;
    local_c8 = local_c8 + lVar37;
    lVar65 = lVar65 + lVar37;
    local_b0 = local_b0 + lVar37;
    lVar64 = lVar64 + lVar37;
    lVar62 = lVar62 + lVar37;
    lVar56 = lVar56 + lVar37;
    lVar66 = lVar66 + lVar37;
  }
  iVar34 = iVar60 * 8;
  lVar40 = lVar63 * 0x20;
  for (; (long)uVar46 < lVar36 + -7; uVar46 = uVar46 + 8) {
    if (iVar17 == 0x10) {
      pvVar38 = B->data;
      iVar35 = j + (int)uVar46;
      iVar49 = iVar35 % 0x10;
      iVar48 = (iVar35 / 0x10) * 0x10;
      pauVar47 = (undefined1 (*) [32])((long)pvVar38 + lVar43 * 4 + (long)(iVar48 * iVar60) * 4);
      iVar35 = iVar58;
      if (iVar49 == 0) {
        while (iVar35 != 0) {
          *pauVar57 = *pauVar47;
          pauVar57 = pauVar57 + 1;
          pauVar47 = pauVar47 + 2;
          iVar35 = iVar35 + -1;
        }
      }
      iVar35 = iVar58;
      if (iVar49 == 4) {
        while (iVar35 != 0) {
          *pauVar57 = *(undefined1 (*) [32])(*pauVar47 + 0x10);
          pauVar57 = pauVar57 + 1;
          pauVar47 = pauVar47 + 2;
          iVar35 = iVar35 + -1;
        }
      }
      iVar35 = iVar58;
      if (iVar49 == 8) {
        while (iVar35 != 0) {
          *pauVar57 = pauVar47[1];
          pauVar57 = pauVar57 + 1;
          pauVar47 = pauVar47 + 2;
          iVar35 = iVar35 + -1;
        }
      }
      if (iVar49 == 0xc) {
        lVar54 = 0;
        iVar35 = iVar58;
        while (bVar67 = iVar35 != 0, iVar35 = iVar35 + -1, bVar67) {
          uVar31 = *(undefined8 *)((long)(pauVar47[1] + lVar54 * 2 + 0x10) + 8);
          *(undefined8 *)(*pauVar57 + lVar54) = *(undefined8 *)(pauVar47[1] + lVar54 * 2 + 0x10);
          *(undefined8 *)((long)(*pauVar57 + lVar54) + 8) = uVar31;
          *(undefined1 (*) [16])(*pauVar57 + lVar54 + 0x10) =
               *(undefined1 (*) [16])
                ((long)pvVar38 + lVar54 * 2 + lVar43 * 4 + (long)((iVar48 + 0x10) * iVar60) * 4);
          lVar54 = lVar54 + 0x20;
        }
        pauVar57 = (undefined1 (*) [32])(*pauVar57 + lVar54);
      }
    }
    if (iVar17 == 8) {
      pvVar38 = B->data;
      iVar48 = (int)uVar46 + j;
      pauVar47 = (undefined1 (*) [32])
                 ((long)pvVar38 + lVar44 * 4 + (long)((iVar48 / 8) * iVar34) * 4);
      iVar35 = iVar58;
      if (iVar48 % 8 == 0) {
        while (iVar35 != 0) {
          *pauVar57 = *pauVar47;
          pauVar57 = pauVar57 + 1;
          pauVar47 = pauVar47 + 1;
          iVar35 = iVar35 + -1;
        }
      }
      if (iVar48 % 8 == 4) {
        lVar54 = 0;
        iVar35 = iVar58;
        while (bVar67 = iVar35 != 0, iVar35 = iVar35 + -1, bVar67) {
          uVar31 = *(undefined8 *)((long)(*pauVar47 + lVar54 + 0x10) + 8);
          *(undefined8 *)(*pauVar57 + lVar54) = *(undefined8 *)(*pauVar47 + lVar54 + 0x10);
          *(undefined8 *)((long)(*pauVar57 + lVar54) + 8) = uVar31;
          *(undefined1 (*) [16])(*pauVar57 + lVar54 + 0x10) =
               *(undefined1 (*) [16])
                ((long)pvVar38 + lVar54 + lVar44 * 4 + (long)(((iVar48 + 8) / 8) * iVar34) * 4);
          lVar54 = lVar54 + 0x20;
        }
        pauVar57 = (undefined1 (*) [32])(*pauVar57 + lVar54);
      }
    }
    if (iVar17 == 4) {
      pvVar38 = B->data;
      iVar35 = iVar58;
      while (bVar67 = iVar35 != 0, iVar35 = iVar35 + -1, bVar67) {
        uVar31 = ((undefined8 *)((long)pvVar38 + lVar53))[1];
        *(undefined8 *)*pauVar57 = *(undefined8 *)((long)pvVar38 + lVar53);
        *(undefined8 *)(*pauVar57 + 8) = uVar31;
        *(undefined1 (*) [16])(*pauVar57 + 0x10) = *(undefined1 (*) [16])((long)pvVar38 + local_110)
        ;
        pauVar57 = pauVar57 + 1;
        pvVar38 = (void *)((long)pvVar38 + 0x10);
      }
    }
    pauVar47 = pauVar57;
    if (iVar17 == 1) {
      pvVar38 = B->data;
      lVar54 = 0;
      lVar59 = 0;
      for (iVar35 = 0; iVar35 + 7 < max_kk; iVar35 = iVar35 + 8) {
        auVar11 = *(undefined1 (*) [32])((long)pvVar38 + lVar59 + local_150);
        auVar70 = *(undefined1 (*) [32])((long)pvVar38 + lVar59 + local_140);
        auVar71 = *(undefined1 (*) [32])((long)pvVar38 + lVar59 + local_118);
        auVar12 = *(undefined1 (*) [32])((long)pvVar38 + lVar59 + local_148);
        auVar13 = *(undefined1 (*) [32])((long)pvVar38 + lVar59 + local_e0);
        auVar72 = *(undefined1 (*) [32])((long)pvVar38 + lVar59 + local_d8);
        auVar14 = *(undefined1 (*) [32])((long)pvVar38 + lVar59 + local_d0);
        auVar15 = *(undefined1 (*) [32])((long)pvVar38 + lVar59 + local_c8);
        auVar16 = vunpcklps_avx(auVar11,auVar70);
        auVar70 = vunpckhps_avx(auVar11,auVar70);
        auVar11 = vunpcklps_avx(auVar71,auVar12);
        auVar71 = vunpckhps_avx(auVar71,auVar12);
        auVar73 = vunpcklps_avx(auVar13,auVar72);
        auVar12 = vunpckhps_avx(auVar13,auVar72);
        auVar74 = vunpcklps_avx(auVar14,auVar15);
        auVar13 = vunpckhps_avx(auVar14,auVar15);
        auVar72 = vunpcklpd_avx(auVar16,auVar11);
        auVar11 = vunpckhpd_avx(auVar16,auVar11);
        auVar14 = vunpcklpd_avx(auVar70,auVar71);
        auVar70 = vunpckhpd_avx(auVar70,auVar71);
        auVar15 = vunpcklpd_avx(auVar73,auVar74);
        auVar71 = vunpckhpd_avx(auVar73,auVar74);
        auVar16 = vunpcklpd_avx(auVar12,auVar13);
        auVar12 = vunpckhpd_avx(auVar12,auVar13);
        auVar73._16_16_ = auVar15._0_16_;
        auVar73._0_16_ = auVar72._0_16_;
        auVar74._16_16_ = auVar71._0_16_;
        auVar74._0_16_ = auVar11._0_16_;
        auVar76._16_16_ = auVar16._0_16_;
        auVar76._0_16_ = auVar14._0_16_;
        auVar77._16_16_ = auVar12._0_16_;
        auVar77._0_16_ = auVar70._0_16_;
        auVar13 = vperm2f128_avx(auVar72,auVar15,0x31);
        auVar11 = vperm2f128_avx(auVar11,auVar71,0x31);
        auVar71 = vperm2f128_avx(auVar14,auVar16,0x31);
        auVar70 = vperm2f128_avx(auVar70,auVar12,0x31);
        *(undefined1 (*) [32])(*pauVar57 + lVar59 * 8) = auVar73;
        *(undefined1 (*) [32])(pauVar57[1] + lVar59 * 8) = auVar74;
        *(undefined1 (*) [32])(pauVar57[2] + lVar59 * 8) = auVar76;
        *(undefined1 (*) [32])(pauVar57[3] + lVar59 * 8) = auVar77;
        *(undefined1 (*) [32])(pauVar57[4] + lVar59 * 8) = auVar13;
        *(undefined1 (*) [32])(pauVar57[5] + lVar59 * 8) = auVar11;
        *(undefined1 (*) [32])(pauVar57[6] + lVar59 * 8) = auVar71;
        *(undefined1 (*) [32])(pauVar57[7] + lVar59 * 8) = auVar70;
        pauVar47 = pauVar47 + 8;
        lVar59 = lVar59 + 0x20;
        lVar54 = lVar54 + 8;
      }
      for (; iVar35 + 3 < max_kk; iVar35 = iVar35 + 4) {
        auVar27 = *(undefined1 (*) [16])((long)pvVar38 + lVar59 + local_150);
        auVar18 = *(undefined1 (*) [16])((long)pvVar38 + lVar59 + local_140);
        auVar19 = *(undefined1 (*) [16])((long)pvVar38 + lVar59 + local_118);
        auVar28 = *(undefined1 (*) [16])((long)pvVar38 + lVar59 + local_148);
        auVar20 = *(undefined1 (*) [16])((long)pvVar38 + lVar59 + local_e0);
        auVar29 = *(undefined1 (*) [16])((long)pvVar38 + lVar59 + local_d8);
        auVar21 = *(undefined1 (*) [16])((long)pvVar38 + lVar59 + local_d0);
        auVar22 = *(undefined1 (*) [16])((long)pvVar38 + lVar59 + local_c8);
        auVar24 = vunpcklps_avx(auVar27,auVar18);
        auVar25 = vunpcklps_avx(auVar19,auVar28);
        auVar18 = vunpckhps_avx(auVar27,auVar18);
        auVar19 = vunpckhps_avx(auVar19,auVar28);
        auVar23 = vunpcklpd_avx(auVar24,auVar25);
        auVar27 = vunpckhpd_avx(auVar24,auVar25);
        auVar24 = vunpcklpd_avx(auVar18,auVar19);
        auVar18 = vunpckhpd_avx(auVar18,auVar19);
        auVar19 = vunpcklps_avx(auVar20,auVar29);
        auVar25 = vunpcklps_avx(auVar21,auVar22);
        auVar28 = vunpckhps_avx(auVar20,auVar29);
        auVar20 = vunpckhps_avx(auVar21,auVar22);
        auVar29 = vunpcklpd_avx(auVar19,auVar25);
        auVar19 = vunpckhpd_avx(auVar19,auVar25);
        auVar21 = vunpcklpd_avx(auVar28,auVar20);
        auVar28 = vunpckhpd_avx(auVar28,auVar20);
        *(undefined1 (*) [16])(*pauVar57 + lVar59 * 8) = auVar23;
        *(undefined1 (*) [16])(*pauVar57 + lVar59 * 8 + 0x10) = auVar29;
        *(undefined1 (*) [16])(pauVar57[1] + lVar59 * 8) = auVar27;
        *(undefined1 (*) [16])(pauVar57[1] + lVar59 * 8 + 0x10) = auVar19;
        *(undefined1 (*) [16])(pauVar57[2] + lVar59 * 8) = auVar24;
        *(undefined1 (*) [16])(pauVar57[2] + lVar59 * 8 + 0x10) = auVar21;
        *(undefined1 (*) [16])(pauVar57[3] + lVar59 * 8) = auVar18;
        *(undefined1 (*) [16])(pauVar57[3] + lVar59 * 8 + 0x10) = auVar28;
        pauVar47 = pauVar47 + 4;
        lVar59 = lVar59 + 0x10;
        lVar54 = lVar54 + 4;
      }
      for (; (int)lVar54 < max_kk; lVar54 = lVar54 + 1) {
        puVar8 = (undefined4 *)((long)pvVar38 + lVar54 * 4 + local_150);
        *(undefined4 *)*pauVar47 = *puVar8;
        *(undefined4 *)(*pauVar47 + 4) = puVar8[lVar63];
        *(undefined4 *)(*pauVar47 + 8) = puVar8[lVar63 * 2];
        *(undefined4 *)(*pauVar47 + 0xc) = puVar8[lVar63 * 3];
        *(undefined4 *)(*pauVar47 + 0x10) = puVar8[lVar63 * 4];
        *(undefined4 *)(*pauVar47 + 0x14) = puVar8[lVar63 * 5];
        *(undefined4 *)(*pauVar47 + 0x18) = puVar8[lVar63 * 6];
        *(undefined4 *)(*pauVar47 + 0x1c) = puVar8[lVar63 * 7];
        pauVar47 = pauVar47 + 1;
      }
    }
    local_150 = local_150 + lVar40;
    local_140 = local_140 + lVar40;
    local_118 = local_118 + lVar40;
    local_148 = local_148 + lVar40;
    lVar53 = lVar53 + lVar40;
    local_110 = local_110 + lVar40;
    local_e0 = local_e0 + lVar40;
    local_d8 = local_d8 + lVar40;
    local_d0 = local_d0 + lVar40;
    local_c8 = local_c8 + lVar40;
    pauVar57 = pauVar47;
  }
  lVar40 = lVar63 * 0x10;
  for (; (long)(uVar46 | 3) < lVar36; uVar46 = uVar46 + 4) {
    if (iVar17 == 0x10) {
      iVar35 = j + (int)uVar46;
      iVar48 = iVar35 % 0x10;
      pauVar41 = (undefined1 (*) [16])
                 ((long)B->data + lVar43 * 4 + (long)((iVar35 / 0x10) * iVar60 * 0x10) * 4);
      iVar35 = iVar58;
      if (iVar48 == 0) {
        while (iVar35 != 0) {
          *(undefined1 (*) [16])*pauVar57 = *pauVar41;
          pauVar57 = (undefined1 (*) [32])(*pauVar57 + 0x10);
          pauVar41 = pauVar41 + 4;
          iVar35 = iVar35 + -1;
        }
      }
      iVar35 = iVar58;
      if (iVar48 == 4) {
        while (iVar35 != 0) {
          *(undefined1 (*) [16])*pauVar57 = pauVar41[1];
          pauVar57 = (undefined1 (*) [32])(*pauVar57 + 0x10);
          pauVar41 = pauVar41 + 4;
          iVar35 = iVar35 + -1;
        }
      }
      iVar35 = iVar58;
      if (iVar48 == 8) {
        while (iVar35 != 0) {
          *(undefined1 (*) [16])*pauVar57 = pauVar41[2];
          pauVar57 = (undefined1 (*) [32])(*pauVar57 + 0x10);
          pauVar41 = pauVar41 + 4;
          iVar35 = iVar35 + -1;
        }
      }
      if (iVar48 == 0xc) {
        pauVar41 = pauVar41 + 3;
        iVar35 = iVar58;
        while (bVar67 = iVar35 != 0, iVar35 = iVar35 + -1, bVar67) {
          *(undefined1 (*) [16])*pauVar57 = *pauVar41;
          pauVar57 = (undefined1 (*) [32])(*pauVar57 + 0x10);
          pauVar41 = pauVar41 + 4;
        }
      }
    }
    if (iVar17 == 8) {
      iVar35 = j + (int)uVar46;
      iVar48 = iVar35 % 8;
      pauVar41 = (undefined1 (*) [16])
                 ((long)B->data + lVar44 * 4 + (long)((iVar35 / 8) * iVar34) * 4);
      iVar35 = iVar58;
      if (iVar48 == 0) {
        while (iVar35 != 0) {
          *(undefined1 (*) [16])*pauVar57 = *pauVar41;
          pauVar57 = (undefined1 (*) [32])(*pauVar57 + 0x10);
          pauVar41 = pauVar41 + 2;
          iVar35 = iVar35 + -1;
        }
      }
      if (iVar48 == 4) {
        pauVar41 = pauVar41 + 1;
        iVar35 = iVar58;
        while (bVar67 = iVar35 != 0, iVar35 = iVar35 + -1, bVar67) {
          *(undefined1 (*) [16])*pauVar57 = *pauVar41;
          pauVar57 = (undefined1 (*) [32])(*pauVar57 + 0x10);
          pauVar41 = pauVar41 + 2;
        }
      }
    }
    if (iVar17 == 4) {
      pauVar41 = (undefined1 (*) [16])
                 ((long)B->data + (long)(k * 4) * 4 + (uVar46 + lVar55) * lVar63 * 4);
      iVar35 = iVar58;
      while (bVar67 = iVar35 != 0, iVar35 = iVar35 + -1, bVar67) {
        *(undefined1 (*) [16])*pauVar57 = *pauVar41;
        pauVar57 = (undefined1 (*) [32])(*pauVar57 + 0x10);
        pauVar41 = pauVar41 + 1;
      }
    }
    pauVar47 = pauVar57;
    if (iVar17 == 1) {
      pvVar38 = B->data;
      lVar54 = 0;
      for (iVar35 = 0; iVar35 + 7 < max_kk; iVar35 = iVar35 + 8) {
        auVar11 = *(undefined1 (*) [32])((long)pvVar38 + lVar54 + local_150);
        auVar70 = *(undefined1 (*) [32])((long)pvVar38 + lVar54 + local_140);
        auVar71 = *(undefined1 (*) [32])((long)pvVar38 + lVar54 + local_118);
        auVar12 = *(undefined1 (*) [32])((long)pvVar38 + lVar54 + local_148);
        auVar13 = vunpcklps_avx(auVar11,auVar70);
        auVar70 = vunpckhps_avx(auVar11,auVar70);
        auVar11 = vunpcklps_avx(auVar71,auVar12);
        auVar71 = vunpckhps_avx(auVar71,auVar12);
        auVar12 = vunpcklpd_avx(auVar13,auVar11);
        auVar11 = vunpckhpd_avx(auVar13,auVar11);
        auVar13 = vunpcklpd_avx(auVar70,auVar71);
        auVar70 = vunpckhpd_avx(auVar70,auVar71);
        auVar71._16_16_ = auVar11._0_16_;
        auVar71._0_16_ = auVar12._0_16_;
        auVar72._16_16_ = auVar70._0_16_;
        auVar72._0_16_ = auVar13._0_16_;
        auVar11 = vperm2f128_avx(auVar12,auVar11,0x31);
        auVar70 = vperm2f128_avx(auVar13,auVar70,0x31);
        *(undefined1 (*) [32])(*pauVar57 + lVar54 * 4) = auVar71;
        *(undefined1 (*) [32])(pauVar57[1] + lVar54 * 4) = auVar72;
        *(undefined1 (*) [32])(pauVar57[2] + lVar54 * 4) = auVar11;
        *(undefined1 (*) [32])(pauVar57[3] + lVar54 * 4) = auVar70;
        pauVar47 = pauVar47 + 4;
        lVar54 = lVar54 + 0x20;
      }
      for (; iVar35 + 3 < max_kk; iVar35 = iVar35 + 4) {
        auVar27 = *(undefined1 (*) [16])((long)pvVar38 + lVar54 + local_150);
        auVar18 = *(undefined1 (*) [16])((long)pvVar38 + lVar54 + local_140);
        auVar19 = *(undefined1 (*) [16])((long)pvVar38 + lVar54 + local_118);
        auVar28 = *(undefined1 (*) [16])((long)pvVar38 + lVar54 + local_148);
        auVar20 = vunpcklps_avx(auVar27,auVar18);
        auVar29 = vunpcklps_avx(auVar19,auVar28);
        auVar18 = vunpckhps_avx(auVar27,auVar18);
        auVar19 = vunpckhps_avx(auVar19,auVar28);
        auVar28 = vunpcklpd_avx(auVar20,auVar29);
        auVar27 = vunpckhpd_avx(auVar20,auVar29);
        auVar20 = vunpcklpd_avx(auVar18,auVar19);
        auVar18 = vunpckhpd_avx(auVar18,auVar19);
        *(undefined1 (*) [16])(*pauVar57 + lVar54 * 4) = auVar28;
        *(undefined1 (*) [16])(*pauVar57 + lVar54 * 4 + 0x10) = auVar27;
        *(undefined1 (*) [16])(pauVar57[1] + lVar54 * 4) = auVar20;
        *(undefined1 (*) [16])(pauVar57[1] + lVar54 * 4 + 0x10) = auVar18;
        pauVar47 = pauVar47 + 2;
        lVar54 = lVar54 + 0x10;
      }
      for (; iVar35 < max_kk; iVar35 = iVar35 + 1) {
        *(undefined4 *)(*pauVar57 + lVar54 * 4) =
             *(undefined4 *)((long)pvVar38 + lVar54 + local_150);
        *(undefined4 *)(*pauVar57 + lVar54 * 4 + 4) =
             *(undefined4 *)((long)pvVar38 + lVar54 + local_140);
        *(undefined4 *)(*pauVar57 + lVar54 * 4 + 8) =
             *(undefined4 *)((long)pvVar38 + lVar54 + local_118);
        *(undefined4 *)(*pauVar57 + lVar54 * 4 + 0xc) =
             *(undefined4 *)((long)pvVar38 + lVar54 + local_148);
        pauVar47 = (undefined1 (*) [32])(*pauVar47 + 0x10);
        lVar54 = lVar54 + 4;
      }
    }
    local_150 = local_150 + lVar40;
    local_140 = local_140 + lVar40;
    local_118 = local_118 + lVar40;
    local_148 = local_148 + lVar40;
    pauVar57 = pauVar47;
  }
  for (; (long)(uVar46 | 1) < lVar36; uVar46 = uVar46 + 2) {
    pvVar38 = B->data;
    lVar40 = 0;
    lVar54 = 0;
    pauVar47 = pauVar57;
    for (iVar60 = 0; iVar60 + 7 < max_kk; iVar60 = iVar60 + 8) {
      auVar11 = *(undefined1 (*) [32])((long)pvVar38 + lVar54 + local_150);
      auVar70 = *(undefined1 (*) [32])((long)pvVar38 + lVar54 + local_140);
      auVar71 = vunpcklps_avx(auVar11,auVar70);
      auVar11 = vunpckhps_avx(auVar11,auVar70);
      auVar70._16_16_ = auVar11._0_16_;
      auVar70._0_16_ = auVar71._0_16_;
      auVar11 = vperm2f128_avx(auVar71,auVar11,0x31);
      *(undefined1 (*) [32])(*pauVar57 + lVar54 * 2) = auVar70;
      *(undefined1 (*) [32])(pauVar57[1] + lVar54 * 2) = auVar11;
      pauVar47 = pauVar47 + 2;
      lVar54 = lVar54 + 0x20;
      lVar40 = lVar40 + 8;
    }
    for (; iVar60 + 3 < max_kk; iVar60 = iVar60 + 4) {
      auVar27 = *(undefined1 (*) [16])((long)pvVar38 + lVar54 + local_150);
      auVar18 = *(undefined1 (*) [16])((long)pvVar38 + lVar54 + local_140);
      auVar19 = vunpcklps_avx(auVar27,auVar18);
      auVar27 = vunpckhps_avx(auVar27,auVar18);
      *(undefined1 (*) [16])(*pauVar57 + lVar54 * 2) = auVar19;
      *(undefined1 (*) [16])(*pauVar57 + lVar54 * 2 + 0x10) = auVar27;
      pauVar47 = pauVar47 + 1;
      lVar54 = lVar54 + 0x10;
      lVar40 = lVar40 + 4;
    }
    for (; (int)lVar40 < max_kk; lVar40 = lVar40 + 1) {
      *(undefined4 *)*pauVar47 = *(undefined4 *)((long)pvVar38 + lVar40 * 4 + local_150);
      *(undefined4 *)(*pauVar47 + 4) = *(undefined4 *)((long)pvVar38 + lVar40 * 4 + local_140);
      pauVar47 = (undefined1 (*) [32])(*pauVar47 + 8);
    }
    local_150 = local_150 + lVar63 * 8;
    local_140 = local_140 + lVar63 * 8;
    pauVar57 = pauVar47;
  }
  for (; (long)uVar46 < lVar36; uVar46 = uVar46 + 1) {
    pvVar38 = B->data;
    pauVar47 = (undefined1 (*) [32])((long)pvVar38 + (long)k * 4 + (uVar46 + lVar55) * lVar63 * 4);
    lVar40 = 0;
    for (iVar60 = 0; iVar60 + 7 < max_kk; iVar60 = iVar60 + 8) {
      *pauVar57 = *pauVar47;
      pauVar57 = pauVar57 + 1;
      pauVar47 = pauVar47 + 1;
      lVar40 = lVar40 + 8;
    }
    for (; iVar60 + 3 < max_kk; iVar60 = iVar60 + 4) {
      *(undefined1 (*) [16])*pauVar57 = *(undefined1 (*) [16])*pauVar47;
      pauVar57 = (undefined1 (*) [32])(*pauVar57 + 0x10);
      pauVar47 = (undefined1 (*) [32])(*pauVar47 + 0x10);
      lVar40 = lVar40 + 4;
    }
    for (; (int)lVar40 < max_kk; lVar40 = lVar40 + 1) {
      *(undefined4 *)*pauVar57 = *(undefined4 *)((long)pvVar38 + lVar40 * 4 + local_150);
      pauVar57 = (undefined1 (*) [32])(*pauVar57 + 4);
    }
    local_150 = local_150 + lVar63 * 4;
  }
  return;
}

Assistant:

static void pack_B_tile(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    const int elempack = B.elempack;
    const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

    float* pp = BT;

    int jj = 0;
#if __SSE2__
    for (; jj + 11 < max_jj; jj += 12)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;
            const float* p1 = (const float*)B + ((j + jj) / 16 * 16 + 16) * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    _mm_store_ps(pp + 8, _mm_load_ps(p0 + 8));
                    pp += 12;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_loadu_ps(p0 + 4));
                    _mm_store_ps(pp + 8, _mm_load_ps(p0 + 12));
                    pp += 12;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0 + 8));
                    _mm_store_ps(pp + 8, _mm_load_ps(p1));
                    pp += 12;
                    p0 += 16;
                    p1 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    _mm256_storeu_ps(pp + 4, _mm256_load_ps(p1));
                    pp += 12;
                    p0 += 16;
                    p1 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;
            const float* p1 = (const float*)B + ((j + jj) / 8 * 8 + 8) * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    _mm_store_ps(pp + 8, _mm_load_ps(p1));
                    pp += 12;
                    p0 += 8;
                    p1 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    _mm256_storeu_ps(pp + 4, _mm256_load_ps(p1));
                    pp += 12;
                    p0 += 8;
                    p1 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;
            const float* p1 = (const float*)B + (j + jj + 4) * B_hstep + k * 4;
            const float* p2 = (const float*)B + (j + jj + 8) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                _mm_store_ps(pp + 8, _mm_load_ps(p2));
                pp += 12;
                p0 += 4;
                p1 += 4;
                p2 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;
            const float* p4 = (const float*)B + (j + jj + 4) * B_hstep + k;
            const float* p5 = (const float*)B + (j + jj + 5) * B_hstep + k;
            const float* p6 = (const float*)B + (j + jj + 6) * B_hstep + k;
            const float* p7 = (const float*)B + (j + jj + 7) * B_hstep + k;
            const float* p8 = (const float*)B + (j + jj + 8) * B_hstep + k;
            const float* p9 = (const float*)B + (j + jj + 9) * B_hstep + k;
            const float* pa = (const float*)B + (j + jj + 10) * B_hstep + k;
            const float* pb = (const float*)B + (j + jj + 11) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                __m256 _r8 = _mm256_loadu_ps(p8);
                __m256 _r9 = _mm256_loadu_ps(p9);
                __m256 _ra = _mm256_loadu_ps(pa);
                __m256 _rb = _mm256_loadu_ps(pb);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 8 * 2, _r2);
                _mm256_storeu_ps(pp + 8 * 3, _r3);
                _mm256_storeu_ps(pp + 8 * 4, _r4);
                _mm256_storeu_ps(pp + 8 * 5, _r5);
                _mm256_storeu_ps(pp + 8 * 6, _r6);
                _mm256_storeu_ps(pp + 8 * 7, _r7);
                _mm256_storeu_ps(pp + 8 * 8, _r8);
                _mm256_storeu_ps(pp + 8 * 9, _r9);
                _mm256_storeu_ps(pp + 8 * 10, _ra);
                _mm256_storeu_ps(pp + 8 * 11, _rb);
                pp += 96;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
                p8 += 8;
                p9 += 8;
                pa += 8;
                pb += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                __m128 _r4 = _mm_loadu_ps(p4);
                __m128 _r5 = _mm_loadu_ps(p5);
                __m128 _r6 = _mm_loadu_ps(p6);
                __m128 _r7 = _mm_loadu_ps(p7);
                __m128 _r8 = _mm_loadu_ps(p8);
                __m128 _r9 = _mm_loadu_ps(p9);
                __m128 _ra = _mm_loadu_ps(pa);
                __m128 _rb = _mm_loadu_ps(pb);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _r1);
                _mm_store_ps(pp + 4 * 4, _r5);
                _mm_store_ps(pp + 4 * 5, _r9);
                _mm_store_ps(pp + 4 * 6, _r2);
                _mm_store_ps(pp + 4 * 7, _r6);
                _mm_store_ps(pp + 4 * 8, _ra);
                _mm_store_ps(pp + 4 * 9, _r3);
                _mm_store_ps(pp + 4 * 10, _r7);
                _mm_store_ps(pp + 4 * 11, _rb);
                pp += 48;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
                p4 += 4;
                p5 += 4;
                p6 += 4;
                p7 += 4;
                p8 += 4;
                p9 += 4;
                pa += 4;
                pb += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp[8] = p8[0];
                pp[9] = p9[0];
                pp[10] = pa[0];
                pp[11] = pb[0];
                pp += 12;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
                p8++;
                p9++;
                pa++;
                pb++;
            }
        }
    }
    for (; jj + 7 < max_jj; jj += 8)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;
            const float* p1 = (const float*)B + ((j + jj) / 16 * 16 + 16) * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_loadu_ps(p0 + 4));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0 + 8));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    _mm_store_ps(pp + 4, _mm_load_ps(p1));
                    pp += 8;
                    p0 += 16;
                    p1 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;
            const float* p1 = (const float*)B + (j + jj + 8) / 8 * 8 * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    pp += 8;
                    p0 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    _mm_store_ps(pp + 4, _mm_load_ps(p1));
                    pp += 8;
                    p0 += 8;
                    p1 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;
            const float* p1 = (const float*)B + (j + jj + 4) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;
            const float* p4 = (const float*)B + (j + jj + 4) * B_hstep + k;
            const float* p5 = (const float*)B + (j + jj + 5) * B_hstep + k;
            const float* p6 = (const float*)B + (j + jj + 6) * B_hstep + k;
            const float* p7 = (const float*)B + (j + jj + 7) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 8 * 2, _r2);
                _mm256_storeu_ps(pp + 8 * 3, _r3);
                _mm256_storeu_ps(pp + 8 * 4, _r4);
                _mm256_storeu_ps(pp + 8 * 5, _r5);
                _mm256_storeu_ps(pp + 8 * 6, _r6);
                _mm256_storeu_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                __m128 _r4 = _mm_loadu_ps(p4);
                __m128 _r5 = _mm_loadu_ps(p5);
                __m128 _r6 = _mm_loadu_ps(p6);
                __m128 _r7 = _mm_loadu_ps(p7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
                p4 += 4;
                p5 += 4;
                p6 += 4;
                p7 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp += 8;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
            }
        }
    }
    for (; jj + 3 < max_jj; jj += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 8));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    pp += 4;
                    p0 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0));
                    pp += 4;
                    p0 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    pp += 4;
                    p0 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 16, _r2);
                _mm256_storeu_ps(pp + 24, _r3);
                pp += 32;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r1);
                _mm_store_ps(pp + 8, _r2);
                _mm_store_ps(pp + 12, _r3);
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp += 4;
                p0++;
                p1++;
                p2++;
                p3++;
            }
        }
    }
#endif // __SSE2__
    for (; jj + 1 < max_jj; jj += 2)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                transpose8x2_ps(_r0, _r1);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp += 2;
                p0++;
                p1++;
            }
        }
    }
    for (; jj < max_jj; jj += 1)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_storeu_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_storeu_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0++;
            }
        }
    }
}